

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::convert
          (mipmapped_texture *this,pixel_format fmt,bool cook,pack_params *p)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level *pmVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  pack_params tmp_params;
  pack_params local_68;
  
  if ((this->m_faces).m_size == 0) {
    bVar12 = false;
  }
  else {
    bVar12 = true;
    if (this->m_format != fmt) {
      uVar11 = (ulong)(this->m_faces).m_size;
      if (uVar11 == 0) {
        uVar6 = 0;
      }
      else {
        pvVar2 = (this->m_faces).m_p;
        uVar8 = 0;
        uVar6 = 0;
        do {
          uVar9 = (ulong)pvVar2[uVar8].m_size;
          if (uVar9 != 0) {
            uVar10 = 0;
            do {
              pmVar3 = pvVar2[uVar8].m_p[uVar10];
              uVar6 = uVar6 + pmVar3->m_height * pmVar3->m_width;
              uVar10 = uVar10 + 1;
            } while (uVar9 != uVar10);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar11);
      }
      bVar12 = (this->m_faces).m_size != 0;
      if (bVar12) {
        uVar7 = p->m_progress_start;
        uVar11 = 0;
        do {
          pvVar2 = (this->m_faces).m_p;
          bVar13 = pvVar2[uVar11].m_size != 0;
          if (bVar13) {
            uVar8 = 0;
            do {
              pmVar3 = pvVar2[uVar11].m_p[uVar8];
              uVar1 = p->m_progress_range;
              uVar5 = (pmVar3->m_height * pmVar3->m_width * uVar1) / uVar6;
              local_68.m_dxt1a_alpha_threshold = p->m_dxt1a_alpha_threshold;
              local_68.m_num_helper_threads = p->m_num_helper_threads;
              local_68.m_quality = p->m_quality;
              local_68.m_compressor = p->m_compressor;
              local_68.m_perceptual = p->m_perceptual;
              local_68.m_dithering = p->m_dithering;
              local_68.m_grayscale_sampling = p->m_grayscale_sampling;
              local_68.m_use_both_block_types = p->m_use_both_block_types;
              local_68.m_endpoint_caching = p->m_endpoint_caching;
              local_68.m_use_transparent_indices_for_black = p->m_use_transparent_indices_for_black;
              local_68._22_2_ = *(undefined2 *)&p->field_0x16;
              local_68.m_pProgress_callback = p->m_pProgress_callback;
              local_68.m_pProgress_callback_user_data_ptr = p->m_pProgress_callback_user_data_ptr;
              local_68.m_pTask_pool = p->m_pTask_pool;
              local_68.m_progress_start = uVar1;
              if (uVar7 < uVar1) {
                local_68.m_progress_start = uVar7;
              }
              local_68.m_progress_range = uVar1 - local_68.m_progress_start;
              if (uVar5 < uVar1 - local_68.m_progress_start) {
                local_68.m_progress_range = uVar5;
              }
              uVar7 = local_68.m_progress_range + uVar7;
              bVar4 = mip_level::convert(pmVar3,fmt,cook,&local_68);
              if (!bVar4) {
                clear(this);
                break;
              }
              uVar8 = uVar8 + 1;
              pvVar2 = (this->m_faces).m_p;
              bVar13 = uVar8 < pvVar2[uVar11].m_size;
            } while (bVar13);
          }
          if (bVar13) {
            if (bVar12) goto LAB_00131b82;
            break;
          }
          uVar11 = uVar11 + 1;
          bVar12 = uVar11 < (this->m_faces).m_size;
        } while (bVar12);
      }
      pmVar3 = *((this->m_faces).m_p)->m_p;
      this->m_format = pmVar3->m_format;
      this->m_comp_flags = pmVar3->m_comp_flags;
      if ((p->m_pProgress_callback == (progress_callback_func)0x0) ||
         (bVar12 = (*p->m_pProgress_callback)
                             (p->m_progress_range + p->m_progress_start,
                              p->m_pProgress_callback_user_data_ptr), bVar12)) {
        bVar12 = true;
      }
      else {
LAB_00131b82:
        bVar12 = false;
      }
      return bVar12;
    }
  }
  return bVar12;
}

Assistant:

inline bool is_valid() const { return m_faces.size() > 0; }